

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O3

REF_STATUS ref_import_ugrid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  long lVar6;
  undefined8 uVar7;
  REF_GLOB n_global;
  char *pcVar8;
  REF_CELL pRVar9;
  uint uVar10;
  REF_INT new_cell;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT face_id;
  REF_INT new_node;
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_INT nnode;
  REF_INT new_qua;
  REF_INT new_tri;
  REF_DBL xyz [3];
  uint local_f4;
  REF_CELL local_f0;
  int local_e4;
  int local_e0;
  REF_INT local_dc;
  uint local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 local_b8;
  int iStack_b0;
  int iStack_ac;
  undefined8 local_a8;
  int iStack_a0;
  int iStack_9c;
  REF_DBL local_48;
  REF_DBL local_40;
  REF_DBL local_38;
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0xf7
             ,"ref_import_ugrid","unable to open file");
      return 2;
    }
    iVar4 = __isoc99_fscanf(__stream,"%d",&local_c4);
    if (iVar4 == 1) {
      iVar4 = __isoc99_fscanf(__stream,"%d",&local_e0);
      if (iVar4 == 1) {
        iVar4 = __isoc99_fscanf(__stream,"%d",&local_e4);
        if (iVar4 == 1) {
          iVar4 = __isoc99_fscanf(__stream,"%d",&local_c8);
          if (iVar4 == 1) {
            iVar4 = __isoc99_fscanf(__stream,"%d",&local_cc);
            if (iVar4 == 1) {
              iVar4 = __isoc99_fscanf(__stream,"%d",&local_d0);
              if (iVar4 == 1) {
                iVar4 = __isoc99_fscanf(__stream,"%d",&local_d4);
                if (iVar4 == 1) {
                  if (0 < ref_mpi->timing) {
                    ref_mpi_stopwatch_stop(ref_mpi,"ugrid header");
                  }
                  n_global = (REF_GLOB)local_c4;
                  if (0 < n_global) {
                    pRVar9 = (REF_CELL)0x0;
                    do {
                      uVar3 = ref_node_add(ref_node,(REF_GLOB)pRVar9,(REF_INT *)&local_d8);
                      if (uVar3 != 0) {
                        pcVar8 = "new_node";
                        uVar7 = 0x104;
                        goto LAB_0015caff;
                      }
                      if (pRVar9 != (REF_CELL)(ulong)local_d8) {
                        pcVar8 = "node index";
                        uVar7 = 0x105;
                        goto LAB_0015ce80;
                      }
                      local_f0 = pRVar9;
                      iVar4 = __isoc99_fscanf(__stream,"%lf",&local_48);
                      if (iVar4 != 1) {
                        pcVar8 = "x";
                        uVar7 = 0x106;
                        goto LAB_0015ce80;
                      }
                      iVar4 = __isoc99_fscanf(__stream,"%lf",&local_40);
                      if (iVar4 != 1) {
                        pcVar8 = "y";
                        uVar7 = 0x107;
                        goto LAB_0015ce80;
                      }
                      iVar4 = __isoc99_fscanf(__stream,"%lf",&local_38);
                      if (iVar4 != 1) {
                        pcVar8 = "z";
                        uVar7 = 0x108;
                        goto LAB_0015ce80;
                      }
                      pRVar2 = ref_node->real;
                      lVar6 = (long)(int)local_d8;
                      pRVar2[lVar6 * 0xf] = local_48;
                      pRVar2[lVar6 * 0xf + 1] = local_40;
                      pRVar2[lVar6 * 0xf + 2] = local_38;
                      pRVar9 = (REF_CELL)((long)&local_f0->type + 1);
                      n_global = (REF_GLOB)local_c4;
                    } while ((long)pRVar9 < n_global);
                  }
                  uVar3 = ref_node_initialize_n_global(ref_node,n_global);
                  if (uVar3 == 0) {
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid node");
                    }
                    local_f0 = pRVar1->cell[3];
                    iStack_ac = -1;
                    if (0 < local_e0) {
                      iVar4 = 0;
                      do {
                        lVar6 = 0;
                        do {
                          iVar5 = __isoc99_fscanf(__stream,"%d",(long)&local_b8 + lVar6);
                          if (iVar5 != 1) {
                            pcVar8 = "tri";
                            uVar7 = 0x116;
                            goto LAB_0015ce80;
                          }
                          lVar6 = lVar6 + 4;
                        } while (lVar6 != 0xc);
                        local_b8 = CONCAT44((int)((ulong)local_b8 >> 0x20) + -1,(int)local_b8 + -1);
                        iStack_b0 = iStack_b0 + -1;
                        uVar3 = ref_cell_add(local_f0,(REF_INT *)&local_b8,&local_bc);
                        if (uVar3 != 0) {
                          pcVar8 = "new tri";
                          uVar7 = 0x11a;
                          goto LAB_0015caff;
                        }
                        if (iVar4 != local_bc) {
                          pcVar8 = "tri index";
                          uVar7 = 0x11b;
                          goto LAB_0015ce80;
                        }
                        iVar4 = iVar4 + 1;
                      } while (iVar4 < local_e0);
                    }
                    local_f0 = pRVar1->cell[6];
                    local_a8 = CONCAT44(local_a8._4_4_,0xffffffff);
                    if (0 < local_e4) {
                      iVar4 = 0;
                      do {
                        lVar6 = 0;
                        do {
                          iVar5 = __isoc99_fscanf(__stream,"%d",(long)&local_b8 + lVar6);
                          if (iVar5 != 1) {
                            pcVar8 = "qua";
                            uVar7 = 0x122;
                            goto LAB_0015ce80;
                          }
                          lVar6 = lVar6 + 4;
                        } while (lVar6 != 0x10);
                        iStack_b0 = iStack_b0 + -1;
                        iStack_ac = iStack_ac + -1;
                        local_b8 = CONCAT44(local_b8._4_4_ + -1,(int)local_b8 + -1);
                        uVar3 = ref_cell_add(local_f0,(REF_INT *)&local_b8,&local_c0);
                        if (uVar3 != 0) {
                          pcVar8 = "new qua";
                          uVar7 = 0x127;
                          goto LAB_0015caff;
                        }
                        if (iVar4 != local_c0) {
                          pcVar8 = "qua index";
                          uVar7 = 0x128;
                          goto LAB_0015ce80;
                        }
                        iVar4 = iVar4 + 1;
                      } while (iVar4 < local_e4);
                    }
                    if (0 < local_e0) {
                      pRVar9 = pRVar1->cell[3];
                      iVar4 = 0;
                      do {
                        iVar5 = __isoc99_fscanf(__stream,"%d",&local_dc);
                        if (iVar5 != 1) {
                          pcVar8 = "tri id";
                          uVar7 = 0x12d;
                          goto LAB_0015ce80;
                        }
                        pRVar9->c2n[(long)pRVar9->size_per * (long)iVar4 + 3] = local_dc;
                        iVar4 = iVar4 + 1;
                      } while (iVar4 < local_e0);
                    }
                    if (0 < local_e4) {
                      pRVar9 = pRVar1->cell[6];
                      iVar4 = 0;
                      do {
                        iVar5 = __isoc99_fscanf(__stream,"%d",&local_dc);
                        if (iVar5 != 1) {
                          pcVar8 = "qua id";
                          uVar7 = 0x133;
                          goto LAB_0015ce80;
                        }
                        pRVar9->c2n[(long)pRVar9->size_per * (long)iVar4 + 4] = local_dc;
                        iVar4 = iVar4 + 1;
                      } while (iVar4 < local_e4);
                    }
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid tri");
                    }
                    if (0 < local_c8) {
                      local_f0 = pRVar1->cell[8];
                      uVar10 = 0;
                      do {
                        lVar6 = 0;
                        do {
                          iVar4 = __isoc99_fscanf(__stream,"%d",(long)&local_b8 + lVar6);
                          if (iVar4 != 1) {
                            pcVar8 = "tet";
                            uVar7 = 0x13b;
                            goto LAB_0015ce80;
                          }
                          lVar6 = lVar6 + 4;
                        } while (lVar6 != 0x10);
                        iStack_b0 = iStack_b0 + -1;
                        iStack_ac = iStack_ac + -1;
                        local_b8 = CONCAT44(local_b8._4_4_ + -1,(int)local_b8 + -1);
                        uVar3 = ref_cell_add(local_f0,(REF_INT *)&local_b8,(REF_INT *)&local_f4);
                        if (uVar3 != 0) {
                          pcVar8 = "new tet";
                          uVar7 = 0x140;
                          goto LAB_0015caff;
                        }
                        if (uVar10 != local_f4) {
                          pcVar8 = "tet index";
                          uVar7 = 0x141;
                          goto LAB_0015ce80;
                        }
                        uVar10 = uVar10 + 1;
                      } while ((int)uVar10 < local_c8);
                    }
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid tet");
                    }
                    if (0 < local_cc) {
                      local_f0 = pRVar1->cell[9];
                      uVar10 = 0;
                      do {
                        lVar6 = 0;
                        do {
                          iVar4 = __isoc99_fscanf(__stream,"%d",(long)&local_b8 + lVar6);
                          if (iVar4 != 1) {
                            pcVar8 = "pyr";
                            uVar7 = 0x148;
                            goto LAB_0015ce80;
                          }
                          lVar6 = lVar6 + 4;
                        } while (lVar6 != 0x14);
                        iStack_b0 = iStack_b0 + -1;
                        iStack_ac = iStack_ac + -1;
                        local_b8 = CONCAT44(local_b8._4_4_ + -1,(int)local_b8 + -1);
                        local_a8 = CONCAT44(local_a8._4_4_,(int)local_a8 + -1);
                        uVar3 = ref_cell_add(local_f0,(REF_INT *)&local_b8,(REF_INT *)&local_f4);
                        if (uVar3 != 0) {
                          pcVar8 = "new pyr";
                          uVar7 = 0x14e;
                          goto LAB_0015caff;
                        }
                        if (uVar10 != local_f4) {
                          pcVar8 = "pyr index";
                          uVar7 = 0x14f;
                          goto LAB_0015ce80;
                        }
                        uVar10 = uVar10 + 1;
                      } while ((int)uVar10 < local_cc);
                    }
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid pyr");
                    }
                    if (0 < local_d0) {
                      local_f0 = pRVar1->cell[10];
                      uVar10 = 0;
                      do {
                        lVar6 = 0;
                        do {
                          iVar4 = __isoc99_fscanf(__stream,"%d",(long)&local_b8 + lVar6);
                          if (iVar4 != 1) {
                            pcVar8 = "pri";
                            uVar7 = 0x156;
                            goto LAB_0015ce80;
                          }
                          lVar6 = lVar6 + 4;
                        } while (lVar6 != 0x18);
                        iStack_b0 = iStack_b0 + -1;
                        iStack_ac = iStack_ac + -1;
                        local_b8 = CONCAT44(local_b8._4_4_ + -1,(int)local_b8 + -1);
                        local_a8 = CONCAT44((int)((ulong)local_a8 >> 0x20) + -1,(int)local_a8 + -1);
                        uVar3 = ref_cell_add(local_f0,(REF_INT *)&local_b8,(REF_INT *)&local_f4);
                        if (uVar3 != 0) {
                          pcVar8 = "new pri";
                          uVar7 = 0x15d;
                          goto LAB_0015caff;
                        }
                        uVar3 = uVar10;
                        if (uVar10 != local_f4) {
                          printf("cell %d %d\n",(ulong)uVar10);
                          uVar3 = local_f4;
                        }
                        if (uVar10 != uVar3) {
                          pcVar8 = "pri index";
                          uVar7 = 0x163;
                          goto LAB_0015ce80;
                        }
                        uVar10 = uVar10 + 1;
                      } while ((int)uVar10 < local_d0);
                    }
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid pri");
                    }
                    if (0 < local_d4) {
                      pRVar9 = pRVar1->cell[0xb];
                      uVar10 = 0;
                      do {
                        lVar6 = 0;
                        do {
                          iVar4 = __isoc99_fscanf(__stream,"%d",(long)&local_b8 + lVar6);
                          if (iVar4 != 1) {
                            pcVar8 = "hex";
                            uVar7 = 0x16a;
                            goto LAB_0015ce80;
                          }
                          lVar6 = lVar6 + 4;
                        } while (lVar6 != 0x20);
                        iStack_b0 = iStack_b0 + -1;
                        iStack_ac = iStack_ac + -1;
                        local_b8 = CONCAT44(local_b8._4_4_ + -1,(int)local_b8 + -1);
                        iStack_a0 = iStack_a0 + -1;
                        iStack_9c = iStack_9c + -1;
                        local_a8 = CONCAT44(local_a8._4_4_ + -1,(int)local_a8 + -1);
                        uVar3 = ref_cell_add(pRVar9,(REF_INT *)&local_b8,(REF_INT *)&local_f4);
                        if (uVar3 != 0) {
                          pcVar8 = "new hex";
                          uVar7 = 0x173;
                          goto LAB_0015caff;
                        }
                        if (uVar10 != local_f4) {
                          pcVar8 = "hex index";
                          uVar7 = 0x174;
                          goto LAB_0015ce80;
                        }
                        uVar10 = uVar10 + 1;
                      } while ((int)uVar10 < local_d4);
                    }
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid hex");
                    }
                    fclose(__stream);
                    return 0;
                  }
                  pcVar8 = "init glob";
                  uVar7 = 0x10e;
                  goto LAB_0015caff;
                }
                pcVar8 = "nhex";
                uVar7 = 0xff;
              }
              else {
                pcVar8 = "npri";
                uVar7 = 0xfe;
              }
            }
            else {
              pcVar8 = "npyr";
              uVar7 = 0xfd;
            }
          }
          else {
            pcVar8 = "ntet";
            uVar7 = 0xfc;
          }
        }
        else {
          pcVar8 = "nqua";
          uVar7 = 0xfb;
        }
      }
      else {
        pcVar8 = "ntri";
        uVar7 = 0xfa;
      }
    }
    else {
      pcVar8 = "nnode";
      uVar7 = 0xf9;
    }
LAB_0015ce80:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar7,
           "ref_import_ugrid",pcVar8);
    uVar3 = 1;
  }
  else {
    pcVar8 = "create grid";
    uVar7 = 0xf1;
LAB_0015caff:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar7,
           "ref_import_ugrid",(ulong)uVar3,pcVar8);
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_import_ugrid(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  REF_INT nnode, ntri, nqua, ntet, npyr, npri, nhex;
  REF_INT node, new_node;
  REF_DBL xyz[3];
  REF_INT tri, new_tri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua, new_qua;
  REF_INT face_id;
  REF_INT cell, new_cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(1, fscanf(file, "%d", &nnode), "nnode");
  RES(1, fscanf(file, "%d", &ntri), "ntri");
  RES(1, fscanf(file, "%d", &nqua), "nqua");
  RES(1, fscanf(file, "%d", &ntet), "ntet");
  RES(1, fscanf(file, "%d", &npyr), "npyr");
  RES(1, fscanf(file, "%d", &npri), "npri");
  RES(1, fscanf(file, "%d", &nhex), "nhex");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid header");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "new_node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
  }

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid node");

  ref_cell = ref_grid_tri(ref_grid);
  nodes[3] = REF_EMPTY;
  for (tri = 0; tri < ntri; tri++) {
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_tri), "new tri");
    RES(tri, new_tri, "tri index");
  }

  ref_cell = ref_grid_qua(ref_grid);
  nodes[4] = REF_EMPTY;
  for (qua = 0; qua < nqua; qua++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "qua");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_qua), "new qua");
    RES(qua, new_qua, "qua index");
  }

  ref_cell = ref_grid_tri(ref_grid);
  for (tri = 0; tri < ntri; tri++) {
    RES(1, fscanf(file, "%d", &face_id), "tri id");
    ref_cell_c2n(ref_cell, 3, tri) = face_id;
  }

  ref_cell = ref_grid_qua(ref_grid);
  for (qua = 0; qua < nqua; qua++) {
    RES(1, fscanf(file, "%d", &face_id), "qua id");
    ref_cell_c2n(ref_cell, 4, qua) = face_id;
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tri");

  ref_cell = ref_grid_tet(ref_grid);
  for (cell = 0; cell < ntet; cell++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tet");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new tet");
    RES(cell, new_cell, "tet index");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tet");

  ref_cell = ref_grid_pyr(ref_grid);
  for (cell = 0; cell < npyr; cell++) {
    for (node = 0; node < 5; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "pyr");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    nodes[4]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new pyr");
    RES(cell, new_cell, "pyr index");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pyr");

  ref_cell = ref_grid_pri(ref_grid);
  for (cell = 0; cell < npri; cell++) {
    for (node = 0; node < 6; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "pri");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    nodes[4]--;
    nodes[5]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new pri");

    if (cell != new_cell) {
      printf("cell %d %d\n", cell, new_cell);
    }

    RES(cell, new_cell, "pri index");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pri");

  ref_cell = ref_grid_hex(ref_grid);
  for (cell = 0; cell < nhex; cell++) {
    for (node = 0; node < 8; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "hex");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    nodes[4]--;
    nodes[5]--;
    nodes[6]--;
    nodes[7]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new hex");
    RES(cell, new_cell, "hex index");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid hex");

  fclose(file);

  return REF_SUCCESS;
}